

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O2

void __thiscall o3dgc::Vector<long>::PushBack(Vector<long> *this,long *value)

{
  ulong uVar1;
  long *__src;
  long lVar2;
  long *__dest;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = this->m_allocated;
  uVar4 = this->m_size;
  if (uVar4 == uVar3) {
    uVar1 = uVar4 * 2;
    uVar3 = 0x20;
    if (0x20 < uVar1) {
      uVar3 = uVar1;
    }
    this->m_allocated = uVar3;
    __dest = (long *)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar3 * 8);
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      __src = this->m_buffer;
      memcpy(__dest,__src,uVar4 * 8);
      if (__src != (long *)0x0) {
        operator_delete__(__src);
        uVar3 = this->m_allocated;
        uVar4 = this->m_size;
      }
    }
    this->m_buffer = __dest;
  }
  if (uVar4 < uVar3) {
    lVar2 = *value;
    this->m_size = uVar4 + 1;
    this->m_buffer[uVar4] = lVar2;
    return;
  }
  __assert_fail("m_size < m_allocated",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcVector.h"
                ,0x58,"void o3dgc::Vector<long>::PushBack(const T &) [T = long]");
}

Assistant:

void                    PushBack(const T & value)
                                {
                                    if (m_size == m_allocated)
                                    {
                                        m_allocated *= 2;
                                        if (m_allocated < O3DGC_DEFAULT_VECTOR_SIZE)
                                        {
                                            m_allocated = O3DGC_DEFAULT_VECTOR_SIZE;
                                        }
                                        T * tmp      = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                    assert(m_size < m_allocated);
                                    m_buffer[m_size++] = value;
                                }